

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O2

void Omega_h::add_end_terminal(Grammar *g)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pPVar4;
  int *piVar5;
  pointer pbVar6;
  bool bVar7;
  int *rhs_symb;
  int *piVar8;
  Production *prod;
  pointer pPVar9;
  allocator local_49;
  value_type local_48;
  
  pPVar4 = (g->productions).
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar9 = (g->productions).
                super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar9 != pPVar4; pPVar9 = pPVar9 + 1) {
    bVar7 = is_nonterminal(g,pPVar9->lhs);
    if (bVar7) {
      pPVar9->lhs = pPVar9->lhs + 1;
    }
    piVar5 = (pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar8 = (pPVar9->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar5; piVar8 = piVar8 + 1) {
      bVar7 = is_nonterminal(g,*piVar8);
      if (bVar7) {
        *piVar8 = *piVar8 + 1;
      }
    }
  }
  iVar3 = g->nterminals;
  pbVar6 = (g->symbol_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_48,"EOF",&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&g->symbol_names,pbVar6 + iVar3,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar1 = g->nsymbols;
  uVar2 = g->nterminals;
  g->nsymbols = uVar1 + 1;
  g->nterminals = uVar2 + 1;
  return;
}

Assistant:

void add_end_terminal(Grammar& g) {
  for (auto& prod : g.productions) {
    if (is_nonterminal(g, prod.lhs)) prod.lhs++;
    for (auto& rhs_symb : prod.rhs) {
      if (is_nonterminal(g, rhs_symb)) rhs_symb++;
    }
  }
  g.symbol_names.insert(g.symbol_names.begin() + g.nterminals, "EOF");
  g.nterminals++;
  g.nsymbols++;
}